

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O1

void * my_canvas_new(t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_iem_fstyle_flags tVar2;
  int iVar3;
  int iVar4;
  t_iemgui *iemgui;
  _glist *p_Var5;
  ulong uVar6;
  t_symbol *ptVar7;
  uint uVar8;
  uint uVar9;
  t_atom *ptVar10;
  int iVar11;
  int iVar12;
  t_float tVar13;
  char str [80];
  int local_a4;
  int local_a0;
  int local_9c;
  t_iemgui_drawfunctions local_88;
  
  iemgui = iemgui_new(my_canvas_class);
  p_Var5 = canvas_getcurrent();
  iVar3 = sys_zoomfontheight(p_Var5->gl_font,1,0);
  iVar3 = iVar3 + 5;
  p_Var5 = canvas_getcurrent();
  iVar4 = sys_zoomfontheight(p_Var5->gl_font,1,0);
  iVar11 = (int)((double)(iVar4 * 100 + 500) / 15.0);
  p_Var5 = canvas_getcurrent();
  iVar4 = sys_zoomfontheight(p_Var5->gl_font,1,0);
  local_9c = (int)((double)(iVar4 * 0x3c + 300) / 15.0);
  iVar4 = iemgui->x_fontsize;
  local_88.draw_new = my_canvas_draw_new;
  local_88.draw_config = my_canvas_draw_config;
  local_88.draw_iolets = my_canvas_draw_io;
  local_88.draw_update = (t_iemdrawfunptr)0x0;
  local_88.draw_select = my_canvas_draw_select;
  local_88.draw_erase = (t_iemdrawfunptr)0x0;
  local_88.draw_move = (t_iemdrawfunptr)0x0;
  iemgui_setdrawfunctions(iemgui,&local_88);
  iemgui->x_fcol = 0;
  iemgui->x_bcol = 0xe0e0e0;
  iemgui->x_lcol = 0x404040;
  if ((((argc - 10U < 4) && (argv->a_type == A_FLOAT)) && (argv[1].a_type == A_FLOAT)) &&
     (argv[2].a_type == A_FLOAT)) {
    tVar13 = atom_getfloatarg(0,argc,argv);
    iVar3 = (int)tVar13;
    tVar13 = atom_getfloatarg(1,argc,argv);
    iVar11 = (int)tVar13;
    tVar13 = atom_getfloatarg(2,argc,argv);
    local_9c = (int)tVar13;
  }
  ptVar10 = argv;
  if ((((argc < 0xc) || (1 < argv[3].a_type - A_FLOAT)) ||
      (iVar12 = 2, 1 < argv[4].a_type - A_FLOAT)) &&
     ((argc != 0xb || (iVar12 = 1, 1 < argv[3].a_type - A_FLOAT)))) {
    ptVar10 = (t_atom *)0x0;
    iVar12 = 0;
  }
  iemgui_new_getnames(iemgui,3,ptVar10);
  local_a4 = 0xc;
  local_a0 = 0x14;
  if (argc - 10U < 4) {
    uVar6 = (ulong)(uint)(iVar12 << 4);
    iVar1 = *(int *)((long)&argv[3].a_type + uVar6);
    if ((((iVar1 - 1U < 2) && (*(int *)((long)&argv[4].a_type + uVar6) == 1)) &&
        (*(int *)((long)&argv[5].a_type + uVar6) == 1)) &&
       ((*(int *)((long)&argv[6].a_type + uVar6) == 1 &&
        (*(int *)((long)&argv[7].a_type + uVar6) == 1)))) {
      if (iVar1 == 1) {
        atom_string((t_atom *)((long)&argv[3].a_type + uVar6),(char *)&local_88,0x50);
        ptVar7 = gensym((char *)&local_88);
      }
      else {
        ptVar7 = iemgui_new_dogetname(iemgui,iVar12 + 3,argv);
      }
      iemgui->x_lab = ptVar7;
      iemgui->x_labelbindex = iVar12 + 4;
      tVar13 = atom_getfloatarg(iVar12 + 4,argc,argv);
      local_a0 = (int)tVar13;
      tVar13 = atom_getfloatarg(iVar12 + 5,argc,argv);
      local_a4 = (int)tVar13;
      tVar13 = atom_getfloatarg(iVar12 + 6,argc,argv);
      iem_inttofstyle(&iemgui->x_fsf,(int)tVar13);
      tVar13 = atom_getfloatarg(iVar12 + 7,argc,argv);
      iVar4 = (int)tVar13;
      iemgui->x_fontsize = iVar4;
      iemgui_all_loadcolors
                (iemgui,(t_atom *)((long)&argv[8].a_type + uVar6),(t_atom *)0x0,
                 (t_atom *)((long)&argv[9].a_type + uVar6));
    }
  }
  if ((argc == 0xd) && (*(int *)((long)&argv[10].a_type + (ulong)(uint)(iVar12 << 4)) == 1)) {
    tVar13 = atom_getfloatarg(iVar12 + 10,0xd,argv);
    iem_inttosymargs(&iemgui->x_isa,(int)tVar13);
  }
  tVar2 = iemgui->x_fsf;
  uVar8 = (uint)(iemgui->x_snd != (t_symbol *)0x0) << 7;
  uVar9 = (uint)(iemgui->x_rcv != (t_symbol *)0x0) << 6;
  iemgui->x_fsf = (t_iem_fstyle_flags)(uVar9 | (uint)tVar2 & 0xffffff3f | uVar8);
  if (iVar3 < 2) {
    iVar3 = 1;
  }
  iemgui->x_w = iVar3;
  if (iVar11 < 2) {
    iVar11 = 1;
  }
  iemgui->x_h = iVar3;
  iVar3 = 1;
  if (1 < local_9c) {
    iVar3 = local_9c;
  }
  *(int *)&iemgui[1].x_glist = iVar11;
  *(int *)((long)&iemgui[1].x_glist + 4) = iVar3;
  if (((uint)tVar2 & 0x3f) == 2) {
    builtin_strncpy(iemgui->x_font,"times",6);
  }
  else if (((uint)tVar2 & 0x3f) == 1) {
    builtin_strncpy(iemgui->x_font,"helvetica",10);
  }
  else {
    iemgui->x_fsf = (t_iem_fstyle_flags)(uVar9 | (uint)tVar2 & 0xffffff00 | uVar8);
    strcpy(iemgui->x_font,sys_font);
  }
  if (((uint)iemgui->x_fsf & 0x40) != 0) {
    pd_bind((t_pd *)iemgui,iemgui->x_rcv);
  }
  iemgui->x_ldx = local_a0;
  iemgui->x_ldy = local_a4;
  iVar11 = 4;
  if (4 < iVar4) {
    iVar11 = iVar4;
  }
  iemgui->x_fontsize = iVar11;
  *(undefined4 *)&iemgui[1].x_obj.te_g.g_pd = 1;
  *(undefined4 *)&iemgui[1].x_obj.te_binbuf = 1;
  iemgui_verify_snd_ne_rcv(iemgui);
  iemgui_newzoom(iemgui);
  return iemgui;
}

Assistant:

static void *my_canvas_new(t_symbol *s, int argc, t_atom *argv)
{
    t_my_canvas *x = (t_my_canvas *)iemgui_new(my_canvas_class);
    int a = IEM_GUI_DEFAULTSIZE;
    int w = 100 * IEM_GUI_DEFAULTSIZE_SCALE, h = 60 * IEM_GUI_DEFAULTSIZE_SCALE;
    int ldx = 20, ldy = 12, f = 2, i = 0;
    int fs = x->x_gui.x_fontsize;

    IEMGUI_SETDRAWFUNCTIONS(x, my_canvas);

    x->x_gui.x_bcol = 0xE0E0E0;
    x->x_gui.x_fcol = 0x00;
    x->x_gui.x_lcol = 0x404040;

    if(((argc >= 10)&&(argc <= 13))
       &&IS_A_FLOAT(argv,0)&&IS_A_FLOAT(argv,1)&&IS_A_FLOAT(argv,2))
    {
        a = atom_getfloatarg(0, argc, argv);
        w = atom_getfloatarg(1, argc, argv);
        h = atom_getfloatarg(2, argc, argv);
    }
    if((argc >= 12)&&(IS_A_SYMBOL(argv,3)||IS_A_FLOAT(argv,3))&&(IS_A_SYMBOL(argv,4)||IS_A_FLOAT(argv,4)))
    {
        i = 2;
        iemgui_new_getnames(&x->x_gui, 3, argv);
    }
    else if((argc == 11)&&(IS_A_SYMBOL(argv,3)||IS_A_FLOAT(argv,3)))
    {
        i = 1;
        iemgui_new_getnames(&x->x_gui, 3, argv);
    }
    else iemgui_new_getnames(&x->x_gui, 3, 0);

    if(((argc >= 10)&&(argc <= 13))
       &&(IS_A_SYMBOL(argv,i+3)||IS_A_FLOAT(argv,i+3))&&IS_A_FLOAT(argv,i+4)
       &&IS_A_FLOAT(argv,i+5)&&IS_A_FLOAT(argv,i+6)
       &&IS_A_FLOAT(argv,i+7))
    {
            /* disastrously, the "label" sits in a different part of the
            message.  So we have to track its location separately (in
            the slot x_labelbindex) and initialize it specially here. */
        if(IS_A_FLOAT(argv, i+3))
        {
            char str[80];
            atom_string(argv+i+3, str, sizeof(str));
            x->x_gui.x_lab = gensym(str);
        } else {
            x->x_gui.x_lab = iemgui_new_dogetname(&x->x_gui, i+3, argv);
        }
        x->x_gui.x_labelbindex = i+4;
        ldx = atom_getfloatarg(i+4, argc, argv);
        ldy = atom_getfloatarg(i+5, argc, argv);
        iem_inttofstyle(&x->x_gui.x_fsf, atom_getfloatarg(i+6, argc, argv));
        fs = atom_getfloatarg(i+7, argc, argv);
        x->x_gui.x_fontsize = fs;
        iemgui_all_loadcolors(&x->x_gui, argv+i+8, 0, argv+i+9);
    }
    if((argc == 13)&&IS_A_FLOAT(argv,i+10))
    {
        iem_inttosymargs(&x->x_gui.x_isa, atom_getfloatarg(i+10, argc, argv));
    }
    x->x_gui.x_fsf.x_snd_able = (0 != x->x_gui.x_snd);
    x->x_gui.x_fsf.x_rcv_able = (0 != x->x_gui.x_rcv);
    if(a < 1)
        a = 1;
    x->x_gui.x_w = a;
    x->x_gui.x_h = x->x_gui.x_w;
    if(w < 1)
        w = 1;
    x->x_vis_w = w;
    if(h < 1)
        h = 1;
    x->x_vis_h = h;
    if(x->x_gui.x_fsf.x_font_style == 1) strcpy(x->x_gui.x_font, "helvetica");
    else if(x->x_gui.x_fsf.x_font_style == 2) strcpy(x->x_gui.x_font, "times");
    else { x->x_gui.x_fsf.x_font_style = 0;
        strcpy(x->x_gui.x_font, sys_font); }
    if (x->x_gui.x_fsf.x_rcv_able)
        pd_bind(&x->x_gui.x_obj.ob_pd, x->x_gui.x_rcv);
    x->x_gui.x_ldx = ldx;
    x->x_gui.x_ldy = ldy;
    x->x_gui.x_fontsize = (fs < 4)?4:fs;
    x->x_at[0].a_type = A_FLOAT;
    x->x_at[1].a_type = A_FLOAT;
    iemgui_verify_snd_ne_rcv(&x->x_gui);
    iemgui_newzoom(&x->x_gui);
    return (x);
}